

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSemaphore.cpp
# Opt level: O0

void __thiscall TPZSemaphore::Post(TPZSemaphore *this)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> *this_00;
  unique_lock<std::mutex> local_18;
  
  this_00 = &local_18;
  std::unique_lock<std::mutex>::unique_lock(this_00,in_RDI);
  (in_RDI->super___mutex_base)._M_mutex.__data.__lock =
       (in_RDI->super___mutex_base)._M_mutex.__data.__lock + 1;
  std::unique_lock<std::mutex>::unlock(this_00);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(this_00);
  return;
}

Assistant:

void TPZSemaphore::Post()
{
	std::unique_lock lck(fMutex);
        
	fCounter++;
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "THREAD IN SEMAPHORE POST: " << std::this_thread::get_id() << " " << __LINE__ << std::endl;
		sout << "FCOUNTER VALUE : " << fCounter << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  lck.unlock();
  fCond.notify_one();
	return;
}